

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Bool poolGrow(STRING_POOL *pool)

{
  block *pbVar1;
  int iVar2;
  BLOCK *pBVar3;
  XML_Char *pXVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  
  pBVar3 = pool->freeBlocks;
  if (pBVar3 == (BLOCK *)0x0) {
LAB_00485b8f:
    pBVar3 = pool->blocks;
    if ((pBVar3 == (BLOCK *)0x0) || (pool->start != pBVar3->s)) {
      iVar2 = *(int *)&pool->end - *(int *)&pool->start;
      if ((-1 < iVar2) && ((uVar8 = 0x400, iVar2 < 0x400 || (uVar8 = iVar2 * 2, -1 < (int)uVar8))))
      {
        iVar5 = uVar8 + 0xc;
        if ((int)(uVar8 + 0xc) < 1) {
          iVar5 = 0;
        }
        iVar2 = 0;
        if (iVar5 == 0) goto LAB_00485cd3;
        pBVar3 = (BLOCK *)(*pool->mem->malloc_fcn)((size_t)iVar5);
        if (pBVar3 != (BLOCK *)0x0) {
          pBVar3->size = uVar8;
          pBVar3->next = pool->blocks;
          pool->blocks = pBVar3;
          sVar7 = (long)pool->ptr - (long)pool->start;
          if (sVar7 != 0) {
            memcpy(pBVar3->s,pool->start,sVar7);
          }
          pool->ptr = pool->ptr + (0xc - (long)pool->start) + (long)(pBVar3->s + -0xc);
          pool->start = pBVar3->s;
          pXVar4 = pBVar3->s + ((ulong)uVar8 - 0xc);
          goto LAB_00485c3b;
        }
      }
    }
    else {
      uVar8 = (*(int *)&pool->end - (int)pool->start) * 2;
      iVar2 = 0;
      if ((int)uVar8 < 0) goto LAB_00485cd3;
      iVar5 = uVar8 + 0xc;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      iVar2 = 0;
      if (iVar5 == 0 || uVar8 == 0) goto LAB_00485cd3;
      pBVar3 = (BLOCK *)(*pool->mem->realloc_fcn)(pBVar3,(size_t)iVar5);
      if (pBVar3 != (BLOCK *)0x0) {
        pool->blocks = pBVar3;
        pBVar3->size = uVar8;
        pool->ptr = pool->ptr + (long)pBVar3 + (0xc - (long)pool->start);
        pool->start = pBVar3->s;
        uVar6 = (ulong)uVar8;
        goto LAB_00485b83;
      }
    }
    iVar2 = 0;
  }
  else {
    pXVar4 = pool->start;
    if (pXVar4 == (XML_Char *)0x0) {
      pool->blocks = pBVar3;
      pool->freeBlocks = pBVar3->next;
      pBVar3->next = (block *)0x0;
      pool->start = pBVar3->s;
      pool->end = pBVar3->s + pBVar3->size;
      pool->ptr = pBVar3->s;
    }
    else {
      sVar7 = (long)pool->end - (long)pXVar4;
      if ((long)pBVar3->size <= (long)sVar7) goto LAB_00485b8f;
      pbVar1 = pBVar3->next;
      pBVar3->next = pool->blocks;
      pool->blocks = pBVar3;
      pool->freeBlocks = pbVar1;
      memcpy(pBVar3->s,pXVar4,sVar7);
      pBVar3 = pool->blocks;
      pool->ptr = pool->ptr + (long)pBVar3 + (0xc - (long)pool->start);
      pool->start = pBVar3->s;
      uVar6 = (ulong)pBVar3->size;
LAB_00485b83:
      pXVar4 = pBVar3->s + (uVar6 - 0xc);
LAB_00485c3b:
      pool->end = pXVar4 + 0xc;
    }
    iVar2 = 1;
  }
LAB_00485cd3:
  return (XML_Bool)iVar2;
}

Assistant:

static XML_Bool FASTCALL
poolGrow(STRING_POOL *pool)
{
  if (pool->freeBlocks) {
    if (pool->start == 0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = NULL;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return XML_TRUE;
    }
    if (pool->end - pool->start < pool->freeBlocks->size) {
      BLOCK *tem = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = tem;
      memcpy(pool->blocks->s, pool->start,
             (pool->end - pool->start) * sizeof(XML_Char));
      pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return XML_TRUE;
    }
  }
  if (pool->blocks && pool->start == pool->blocks->s) {
    BLOCK *temp;
    int blockSize = (int)((unsigned)(pool->end - pool->start)*2U);
    size_t bytesToAllocate;

    if (blockSize < 0)
      return XML_FALSE;

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    temp = (BLOCK *)
      pool->mem->realloc_fcn(pool->blocks, (unsigned)bytesToAllocate);
    if (temp == NULL)
      return XML_FALSE;
    pool->blocks = temp;
    pool->blocks->size = blockSize;
    pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
    pool->start = pool->blocks->s;
    pool->end = pool->start + blockSize;
  }
  else {
    BLOCK *tem;
    int blockSize = (int)(pool->end - pool->start);
    size_t bytesToAllocate;

    if (blockSize < 0)
      return XML_FALSE;

    if (blockSize < INIT_BLOCK_SIZE)
      blockSize = INIT_BLOCK_SIZE;
    else {
      /* Detect overflow, avoiding _signed_ overflow undefined behavior */
      if ((int)((unsigned)blockSize * 2U) < 0) {
        return XML_FALSE;
      }
      blockSize *= 2;
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    tem = (BLOCK *)pool->mem->malloc_fcn(bytesToAllocate);
    if (!tem)
      return XML_FALSE;
    tem->size = blockSize;
    tem->next = pool->blocks;
    pool->blocks = tem;
    if (pool->ptr != pool->start)
      memcpy(tem->s, pool->start,
             (pool->ptr - pool->start) * sizeof(XML_Char));
    pool->ptr = tem->s + (pool->ptr - pool->start);
    pool->start = tem->s;
    pool->end = tem->s + blockSize;
  }
  return XML_TRUE;
}